

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

void __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::fillPriorityQueue(ComplexToSimple *this)

{
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *this_00;
  int iVar1;
  int iVar2;
  Edge *pEVar3;
  QPodPoint *pQVar4;
  QPodPoint QVar5;
  QPodPoint QVar6;
  long lVar7;
  Event *pEVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  this_00 = &this->m_events;
  (this->m_events).siz = 0;
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::reserve
            (this_00,(this->m_edges).siz * 2);
  if (0 < (this->m_edges).siz) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      pEVar3 = (this->m_edges).buffer;
      iVar1 = *(int *)((long)&pEVar3->to + lVar11);
      pQVar4 = (this->m_parent->m_vertices).buffer;
      iVar2 = *(int *)((long)&pEVar3->from + lVar11);
      if ((pQVar4[iVar1].x != pQVar4[iVar2].x) || (pQVar4[iVar1].y != pQVar4[iVar2].y)) {
        QVar5 = pQVar4[*(int *)((long)&pEVar3->from +
                               (ulong)(&pEVar3->pointingUp)[lVar11] * 4 + lVar11)];
        QVar6 = pQVar4[*(int *)((long)&pEVar3->from +
                               (ulong)((&pEVar3->pointingUp)[lVar11] ^ 1) * 4 + lVar11)];
        QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::reserve
                  (this_00,(this->m_events).siz + 1);
        lVar7 = (this->m_events).siz;
        pEVar8 = (this->m_events).buffer;
        pEVar8[lVar7].point = QVar5;
        pEVar8[lVar7].type = Upper;
        pEVar8[lVar7].edge = (int)lVar10;
        (this->m_events).siz = lVar7 + 1;
        QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::reserve
                  (this_00,lVar7 + 2);
        lVar7 = (this->m_events).siz;
        pEVar8 = (this->m_events).buffer;
        pEVar8[lVar7].point = QVar6;
        pEVar8[lVar7].type = Lower;
        pEVar8[lVar7].edge = (int)lVar10;
        (this->m_events).siz = lVar7 + 1;
      }
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar10 < (this->m_edges).siz);
  }
  uVar9 = (this->m_events).siz;
  if (uVar9 != 0) {
    pEVar8 = (this->m_events).buffer;
    lVar10 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<QTriangulator<unsigned_short>::ComplexToSimple::Event*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar8,pEVar8 + uVar9,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<QTriangulator<unsigned_short>::ComplexToSimple::Event*,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar8,pEVar8 + uVar9);
    return;
  }
  return;
}

Assistant:

void QTriangulator<T>::ComplexToSimple::fillPriorityQueue()
{
    m_events.reset();
    m_events.reserve(m_edges.size() * 2);
    for (int i = 0; i < m_edges.size(); ++i) {
        Q_ASSERT(m_edges.at(i).previous == -1 && m_edges.at(i).next == -1);
        Q_ASSERT(m_edges.at(i).node == nullptr);
        Q_ASSERT(m_edges.at(i).pointingUp == m_edges.at(i).originallyPointingUp);
        Q_ASSERT(m_edges.at(i).pointingUp == (m_parent->m_vertices.at(m_edges.at(i).to) < m_parent->m_vertices.at(m_edges.at(i).from)));
        // Ignore zero-length edges.
        if (m_parent->m_vertices.at(m_edges.at(i).to) != m_parent->m_vertices.at(m_edges.at(i).from)) {
            QPodPoint upper = m_parent->m_vertices.at(m_edges.at(i).upper());
            QPodPoint lower = m_parent->m_vertices.at(m_edges.at(i).lower());
            Event upperEvent = {{upper.x, upper.y}, Event::Upper, i};
            Event lowerEvent = {{lower.x, lower.y}, Event::Lower, i};
            m_events.add(upperEvent);
            m_events.add(lowerEvent);
        }
    }

    std::sort(m_events.data(), m_events.data() + m_events.size());
}